

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O3

void simd::ProjectionProfile
               (Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,bool horizontal,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *projection,SIMDType simdType)

{
  byte bVar1;
  uint32_t rowSize;
  uint32_t *out;
  uint32_t *puVar2;
  uint uVar3;
  SIMDType SVar4;
  uint uVar5;
  ulong __new_size;
  uint simdWidth;
  
  bVar1 = image->_colorCount;
  uVar3 = height * width * (uint)bVar1;
  do {
    SVar4 = simdType;
    if (SVar4 != avx_function) {
      if (SVar4 - sse_function < 2) {
        uVar5 = 0x10;
        if (0xf < uVar3) goto LAB_00131d6a;
      }
      else {
        uVar5 = 0;
        if (SVar4 != cpu_function) goto LAB_00131d6a;
      }
      Image_Function::ProjectionProfile(image,x,y,width,height,horizontal,projection);
      return;
    }
    simdType = sse_function;
  } while (uVar3 < 0x20);
  uVar5 = 0x20;
LAB_00131d6a:
  __new_size = (ulong)height;
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (image,x,y,width,height);
  uVar3 = width * bVar1;
  if (horizontal) {
    __new_size = (ulong)uVar3;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(projection,__new_size);
  out = (projection->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start;
  puVar2 = (projection->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (out != puVar2) {
    memset(out,0,((long)puVar2 + (-4 - (long)out) & 0xfffffffffffffffcU) + 4);
  }
  rowSize = image->_rowSize;
  simdWidth = uVar3 / uVar5;
  if (SVar4 == sse_function) {
    sse::ProjectionProfile
              (rowSize,image->_data + (ulong)(bVar1 * x) + (ulong)(y * rowSize),height,horizontal,
               out,simdWidth,simdWidth * uVar5,uVar3 % uVar5);
  }
  else if (SVar4 == avx_function) {
    avx::ProjectionProfile
              (rowSize,image->_data + (ulong)(bVar1 * x) + (ulong)(y * rowSize),height,horizontal,
               out,simdWidth,simdWidth * uVar5,uVar3 % uVar5);
  }
  return;
}

Assistant:

void ProjectionProfile( const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height, bool horizontal,
                            std::vector < uint32_t > & projection, SIMDType simdType )
    {
        const uint32_t simdSize = getSimdSize( simdType );
        const uint8_t colorCount = image.colorCount();

        if( (simdType == cpu_function) || ((width * height * colorCount) < simdSize) ) {
            AVX_CODE( ProjectionProfile( image, x, y, width, height, horizontal, projection, sse_function ); )

            Image_Function::ProjectionProfile( image, x, y, width, height, horizontal, projection );
            return;
        }
        Image_Function::ParameterValidation( image, x, y, width, height );
        width = width * colorCount;

        projection.resize( horizontal ? width : height );
        std::fill( projection.begin(), projection.end(), 0u );
        uint32_t * out = projection.data();

        const uint32_t rowSize = image.rowSize();

        const uint8_t * imageStart = image.data() + y * rowSize + x * colorCount; 

        const uint32_t simdWidth = width / simdSize;
        const uint32_t totalSimdWidth = simdWidth * simdSize;
        const uint32_t nonSimdWidth = width - totalSimdWidth;

        AVX_CODE( avx::ProjectionProfile( rowSize, imageStart, height, horizontal, out, simdWidth, totalSimdWidth, nonSimdWidth ) )
        SSE_CODE( sse::ProjectionProfile( rowSize, imageStart, height, horizontal, out, simdWidth, totalSimdWidth, nonSimdWidth ) )
        NEON_CODE( neon::ProjectionProfile( rowSize, imageStart, height, horizontal, out, simdWidth, totalSimdWidth, nonSimdWidth ) )
    }